

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deInt32.h
# Opt level: O2

deUint32 deUint32Hash(deUint32 v)

{
  uint uVar1;
  deUint32 key;
  
  uVar1 = (v >> 0x10 ^ v ^ 0x3d) * 9;
  uVar1 = (uVar1 >> 4 ^ uVar1) * 0x27d4eb2d;
  return uVar1 >> 0xf ^ uVar1;
}

Assistant:

DE_INLINE deUint32 deInt32Hash (deInt32 a)
{
	/* From: http://www.concentric.net/~Ttwang/tech/inthash.htm */
	deUint32 key = (deUint32)a;
	key = (key ^ 61) ^ (key >> 16);
	key = key + (key << 3);
	key = key ^ (key >> 4);
	key = key * 0x27d4eb2d; /* prime/odd constant */
	key = key ^ (key >> 15);
	return key;
}